

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O2

int32_t op_exponent(int32_t base,uint32_t power)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  while( true ) {
    iVar1 = base;
    if ((power & 1) == 0) {
      iVar1 = 1;
    }
    iVar2 = iVar1 * iVar2;
    if (power < 2) break;
    power = power >> 1;
    base = base * base;
  }
  return iVar2;
}

Assistant:

int32_t op_exponent(int32_t base, uint32_t power)
{
	int32_t result = 1;

	for (;;) {
		if (power % 2)
			result *= base;
		power /= 2;
		if (!power)
			break;
		base *= base;
	}

	return result;
}